

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameBase.h
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
BayesianGameBase::JointToIndividualTypeIndices(BayesianGameBase *this,Index jTypeI)

{
  bool bVar1;
  reference this_00;
  size_type sVar2;
  uint in_ESI;
  long in_RDI;
  map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  *in_stack_ffffffffffffff88;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff98;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffffa0;
  undefined1 local_40 [8];
  key_type *in_stack_ffffffffffffffc8;
  map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  *in_stack_ffffffffffffffd0;
  _Self local_28;
  _Self local_20;
  uint local_14;
  mapped_type *local_8;
  
  local_14 = in_ESI;
  if ((*(byte *)(in_RDI + 8) & 1) == 0) {
    this_00 = std::
              vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ::operator[](*(vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             **)(in_RDI + 0x60),(ulong)in_ESI);
    sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(this_00);
    if (sVar2 == 0) {
      IndexTools::JointToIndividualIndices((uint)&stack0xffffffffffffff98,(vector *)(ulong)local_14)
      ;
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::operator[](*(vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     **)(in_RDI + 0x60),(ulong)local_14);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(in_stack_ffffffffffffffa0);
    }
    local_8 = std::
              vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ::operator[](*(vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             **)(in_RDI + 0x60),(ulong)local_14);
  }
  else {
    local_20._M_node =
         (_Base_ptr)
         std::
         map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
         ::find(in_stack_ffffffffffffff88,(key_type *)0x13b294);
    local_28._M_node =
         (_Base_ptr)
         std::
         map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
         ::end(in_stack_ffffffffffffff88);
    bVar1 = std::operator==(&local_20,&local_28);
    if (bVar1) {
      IndexTools::JointToIndividualIndices((uint)local_40,(vector *)(ulong)local_14);
      std::
      map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
      ::operator[](in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(in_stack_ffffffffffffffa0);
    }
    local_8 = std::
              map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
              ::operator[](in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  }
  return local_8;
}

Assistant:

const std::vector<Index>& JointToIndividualTypeIndices(Index jTypeI) const
        {
            if(_m_useSparse)
            {
                if((*_m_jointToIndTypesMap).find(jTypeI)==
                   (*_m_jointToIndTypesMap).end())
                    (*_m_jointToIndTypesMap)[jTypeI]=
                        IndexTools::JointToIndividualIndices(
                            jTypeI, _m_nrTypes);
                return((*_m_jointToIndTypesMap)[jTypeI]);
                    
            }
            else
            {
                if((*_m_jointToIndTypes)[jTypeI].size()==0)
                    (*_m_jointToIndTypes)[jTypeI]=
                        IndexTools::JointToIndividualIndices(
                            jTypeI, _m_nrTypes);
                return((*_m_jointToIndTypes)[jTypeI]);
            }
        }